

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tree_state_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                      nk_collapse_states *state)

{
  int *piVar1;
  nk_vec2 nVar2;
  nk_collapse_states nVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  nk_rect r;
  nk_rect rect;
  nk_rect r_00;
  char *string;
  nk_widget_layout_states nVar6;
  int iVar7;
  nk_symbol_type *pnVar8;
  long lVar9;
  nk_context *i;
  long lVar10;
  nk_command_buffer *b;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect r_01;
  nk_rect b_00;
  nk_rect header;
  nk_flags ws;
  nk_text text;
  nk_rect local_c8;
  nk_flags local_ac;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  float local_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  nk_collapse_states *local_68;
  char *local_60;
  nk_text local_58;
  undefined1 local_48 [16];
  
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.w = 0.0;
  local_c8.h = 0.0;
  local_ac = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x47c0,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x47c1,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  pnVar5 = pnVar4->layout;
  local_68 = state;
  local_60 = title;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x47c2,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  b = &pnVar4->buffer;
  local_78 = (ctx->style).window.spacing.x;
  local_8c = (ctx->style).window.spacing.y;
  fVar14 = (ctx->style).tab.padding.y;
  nk_row_layout(ctx,NK_DYNAMIC,fVar14 + fVar14 + ((ctx->style).font)->height,1,0);
  nVar6 = nk_widget(&local_c8,ctx);
  if (type == NK_TREE_TAB) {
    if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
      r.y = local_c8.y;
      r.x = local_c8.x;
      r.w = local_c8.w;
      r.h = local_c8.h;
      nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
      local_58.background.r = '\0';
      local_58.background.g = '\0';
      local_58.background.b = '\0';
      local_58.background.a = '\0';
    }
    else {
      local_58.background = (ctx->style).tab.background.data.color;
      rect.y = local_c8.y;
      rect.x = local_c8.x;
      rect.w = local_c8.w;
      rect.h = local_c8.h;
      nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
      fVar14 = (ctx->style).tab.border;
      auVar13._4_4_ = local_c8.h;
      auVar13._0_4_ = local_c8.w;
      rect_00.x = fVar14 + local_c8.x;
      rect_00.y = fVar14 + local_c8.y;
      fVar14 = fVar14 + fVar14;
      auVar12._4_4_ = fVar14;
      auVar12._0_4_ = fVar14;
      auVar12._8_4_ = fVar14;
      auVar12._12_4_ = fVar14;
      auVar13._8_8_ = 0;
      auVar13 = maxps(auVar12,auVar13);
      rect_00.w = auVar13._0_4_ - fVar14;
      rect_00.h = auVar13._4_4_ - fVar14;
      nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
    }
  }
  else {
    local_58.background = (ctx->style).window.background;
  }
  i = (nk_context *)0x0;
  if (nVar6 == NK_WIDGET_VALID && (pnVar5->flags & 0x800) == 0) {
    i = ctx;
  }
  local_a8 = local_c8.x;
  fStack_a4 = local_c8.y;
  r_00.y = local_c8.y;
  r_00.x = local_c8.x;
  r_00.w = local_c8.w;
  r_00.h = local_c8.h;
  uStack_a0 = 0;
  iVar7 = nk_button_behavior(&local_ac,r_00,&i->input,NK_BUTTON_DEFAULT);
  nVar3 = *local_68;
  if (iVar7 == 0) {
    if (nVar3 != NK_MAXIMIZED) goto LAB_0012b6be;
  }
  else {
    *local_68 = (uint)(nVar3 != NK_MAXIMIZED);
    if (nVar3 == NK_MAXIMIZED) {
LAB_0012b6be:
      pnVar8 = &(ctx->style).tab.sym_minimize;
      lVar9 = 0x1868;
      lVar10 = 0x19c8;
      goto LAB_0012b6d3;
    }
  }
  pnVar8 = &(ctx->style).tab.sym_maximize;
  lVar9 = 0x17b8;
  lVar10 = 0x1918;
LAB_0012b6d3:
  if (type == NK_TREE_TAB) {
    lVar10 = lVar9;
  }
  font = (ctx->style).font;
  fVar14 = font->height;
  local_48 = ZEXT416((uint)fVar14);
  local_88 = CONCAT412(fVar14,CONCAT48(fVar14,CONCAT44(fVar14,fVar14)));
  nVar2 = (ctx->style).tab.padding;
  bounds.x = local_a8 + nVar2.x;
  bounds.y = fStack_a4 + nVar2.y;
  uStack_a0._0_4_ = (float)uStack_a0 + 0.0;
  uStack_a0._4_4_ = uStack_a0._4_4_ + 0.0;
  bounds.w = fVar14;
  bounds.h = fVar14;
  local_a8 = bounds.x;
  fStack_a4 = bounds.y;
  nk_do_button_symbol(&local_ac,b,bounds,*pnVar8,NK_BUTTON_DEFAULT,
                      (nk_style_button *)((long)&(ctx->input).keyboard.keys[0].down + lVar10),
                      (nk_input *)0x0,font);
  auVar13 = local_88;
  if (img == (nk_image *)0x0) {
    fVar14 = ((ctx->style).font)->height;
  }
  else {
    local_a8 = local_78 * 4.0 + (float)local_48._0_4_ + local_a8;
    r_01.y = fStack_a4;
    r_01.x = local_a8;
    r_01.w = (float)local_88._0_4_;
    r_01.h = (float)local_88._4_4_;
    local_88 = auVar13;
    nk_draw_image(b,r_01,img,(nk_color)0xffffffff);
    fVar14 = ((ctx->style).font)->height;
    local_88._0_4_ = (ctx->style).tab.spacing.x + fVar14;
  }
  string = local_60;
  fVar15 = local_78 + (float)local_88._0_4_;
  if (local_78 + (float)local_88._0_4_ <= local_c8.w) {
    fVar15 = local_c8.w;
  }
  local_78 = local_a8 + (float)local_88._0_4_ + local_78;
  fStack_74 = fStack_a4;
  fStack_70 = (float)uStack_a0;
  fStack_6c = uStack_a0._4_4_;
  local_88._4_4_ = fVar14;
  local_88._0_4_ = fVar15 - (local_8c + (float)local_88._0_4_ + (ctx->style).tab.indent);
  local_88._8_8_ = 0;
  local_58.text = (ctx->style).tab.text;
  local_58.padding.x = 0.0;
  local_58.padding.y = 0.0;
  local_c8.w = fVar15;
  iVar7 = nk_strlen(local_60);
  auVar13 = local_88;
  b_00.y = fStack_a4;
  b_00.x = local_78;
  b_00.w = (float)local_88._0_4_;
  b_00.h = (float)local_88._4_4_;
  local_88 = auVar13;
  nk_widget_text(b,b_00,string,iVar7,&local_58,0x11,(ctx->style).font);
  iVar7 = 0;
  if (*local_68 == NK_MAXIMIZED) {
    fVar14 = (ctx->style).tab.indent;
    pnVar5->at_x = (float)*pnVar5->offset_x + local_c8.x + fVar14;
    fVar15 = (pnVar5->bounds).w;
    fVar11 = fVar14;
    if (fVar14 <= fVar15) {
      fVar11 = fVar15;
    }
    (pnVar5->bounds).w = fVar11 - (fVar14 + (ctx->style).window.padding.x);
    piVar1 = &(pnVar5->row).tree_depth;
    *piVar1 = *piVar1 + 1;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

NK_INTERN int
nk_tree_state_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states *state)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;
    const struct nk_input *in;
    const struct nk_style_button *button;
    enum nk_symbol_type symbol;

    struct nk_vec2 item_spacing;
    struct nk_rect header = {0,0,0,0};
    struct nk_rect sym = {0,0,0,0};
    struct nk_text text;

    nk_flags ws = 0;
    enum nk_widget_layout_states widget_state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* cache some data */
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    style = &ctx->style;
    item_spacing = style->window.spacing;

    /* calculate header bounds and draw background */
    nk_layout_row_dynamic(ctx, style->font->height + 2 * style->tab.padding.y, 1);
    widget_state = nk_widget(&header, ctx);
    if (type == NK_TREE_TAB) {
        const struct nk_style_item *background = &style->tab.background;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            nk_draw_image(out, header, &background->data.image, nk_white);
            text.background = nk_rgba(0,0,0,0);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, style->tab.border_color);
            nk_fill_rect(out, nk_shrink_rect(header, style->tab.border),
                style->tab.rounding, background->data.color);
        }
    } else text.background = style->window.background;

    /* update node state */
    in = (!(layout->flags & NK_WINDOW_ROM)) ? &ctx->input: 0;
    in = (in && widget_state == NK_WIDGET_VALID) ? &ctx->input : 0;
    if (nk_button_behavior(&ws, header, in, NK_BUTTON_DEFAULT))
        *state = (*state == NK_MAXIMIZED) ? NK_MINIMIZED : NK_MAXIMIZED;

    /* select correct button style */
    if (*state == NK_MAXIMIZED) {
        symbol = style->tab.sym_maximize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_maximize_button;
        else button = &style->tab.node_maximize_button;
    } else {
        symbol = style->tab.sym_minimize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_minimize_button;
        else button = &style->tab.node_minimize_button;
    }

    {/* draw triangle button */
    sym.w = sym.h = style->font->height;
    sym.y = header.y + style->tab.padding.y;
    sym.x = header.x + style->tab.padding.x;
    nk_do_button_symbol(&ws, &win->buffer, sym, symbol, NK_BUTTON_DEFAULT,
        button, 0, style->font);

    if (img) {
        /* draw optional image icon */
        sym.x = sym.x + sym.w + 4 * item_spacing.x;
        nk_draw_image(&win->buffer, sym, img, nk_white);
        sym.w = style->font->height + style->tab.spacing.x;}
    }

    {/* draw label */
    struct nk_rect label;
    header.w = NK_MAX(header.w, sym.w + item_spacing.x);
    label.x = sym.x + sym.w + item_spacing.x;
    label.y = sym.y;
    label.w = header.w - (sym.w + item_spacing.y + style->tab.indent);
    label.h = style->font->height;
    text.text = style->tab.text;
    text.padding = nk_vec2(0,0);
    nk_widget_text(out, label, title, nk_strlen(title), &text,
        NK_TEXT_LEFT, style->font);}

    /* increase x-axis cursor widget position pointer */
    if (*state == NK_MAXIMIZED) {
        layout->at_x = header.x + *layout->offset_x + style->tab.indent;
        layout->bounds.w = NK_MAX(layout->bounds.w, style->tab.indent);
        layout->bounds.w -= (style->tab.indent + style->window.padding.x);
        layout->row.tree_depth++;
        return nk_true;
    } else return nk_false;
}